

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

int __thiscall
xla::GraphCycles::FindPath(GraphCycles *this,int32_t x,int32_t y,int max_path_len,int32_t *path)

{
  Rep *pRVar1;
  iterator iVar2;
  pointer pNVar3;
  int *piVar4;
  int iVar5;
  pointer piVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  bool bVar10;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar11;
  int w;
  NodeSet seen;
  int local_98;
  int local_94;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_90;
  int local_84;
  int32_t local_80;
  int32_t local_7c;
  vector<int,std::allocator<int>> *local_78;
  int32_t *local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  pRVar1 = this->rep_;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  piVar6 = (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar6) {
    (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar6;
  }
  iVar2._M_current =
       (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_80 = y;
  local_7c = x;
  local_70 = path;
  if (iVar2._M_current ==
      (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pRVar1->stack_,iVar2,&local_7c);
  }
  else {
    *iVar2._M_current = x;
    (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  piVar6 = (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != piVar6) {
    local_98 = 0;
    local_78 = (vector<int,std::allocator<int>> *)&pRVar1->stack_;
    do {
      iVar2._M_current = piVar6 + -1;
      iVar7 = piVar6[-1];
      lVar9 = (long)iVar7;
      (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar2._M_current;
      if (lVar9 < 0) {
        local_98 = local_98 + -1;
        bVar10 = false;
        iVar5 = local_84;
      }
      else {
        if (local_98 < max_path_len) {
          local_70[local_98] = iVar7;
        }
        local_90 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(local_90._4_4_,0xffffffff);
        if (iVar2._M_current ==
            (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_78,iVar2,(int *)&local_90);
        }
        else {
          piVar6[-1] = -1;
          (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar6;
        }
        local_98 = local_98 + 1;
        bVar10 = true;
        iVar5 = local_98;
        if (iVar7 != local_80) {
          pNVar3 = (pRVar1->node_io_).
                   super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar4 = *(pointer *)
                    ((long)&pNVar3[lVar9].out.value_sequence_.
                            super__Vector_base<int,_std::allocator<int>_> + 8);
          bVar10 = false;
          for (piVar8 = *(int **)&pNVar3[lVar9].out.value_sequence_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl;
              iVar5 = local_84, piVar8 != piVar4; piVar8 = piVar8 + 1) {
            local_94 = *piVar8;
            local_90 = &local_68;
            pVar11 = std::
                     _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     ::
                     _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                               ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                 *)&local_68,&local_94,&local_90);
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              iVar2._M_current =
                   (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_78,iVar2,&local_94);
              }
              else {
                *iVar2._M_current = local_94;
                (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              }
            }
          }
        }
      }
      local_84 = iVar5;
      iVar7 = local_84;
      if (bVar10) goto LAB_001b0205;
      piVar6 = (pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while ((pRVar1->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start != piVar6);
  }
  iVar7 = 0;
LAB_001b0205:
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return iVar7;
}

Assistant:

int GraphCycles::FindPath(int32_t x, int32_t y, int max_path_len,
                          int32_t path[]) const {
  // Forward depth first search starting at x until we hit y.
  // As we descend into a node, we push it onto the path.
  // As we leave a node, we remove it from the path.
  int path_len = 0;

  Rep* r = rep_;
  NodeSet seen;
  r->stack_.clear();
  r->stack_.push_back(x);
  while (!r->stack_.empty()) {
    int32_t n = r->stack_.back();
    r->stack_.pop_back();
    if (n < 0) {
      // Marker to indicate that we are leaving a node
      path_len--;
      continue;
    }

    if (path_len < max_path_len) {
      path[path_len] = n;
    }
    path_len++;
    r->stack_.push_back(-1);  // Will remove tentative path entry

    if (n == y) {
      return path_len;
    }

    for (auto w : r->node_io_[n].out.GetSequence()) {
      if (seen.insert(w).second) {
        r->stack_.push_back(w);
      }
    }
  }

  return 0;
}